

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void doctest::detail::registerReporterImpl
               (char *name,int priority,reporterCreatorFunc c,bool isReporter)

{
  pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>
  *this;
  byte in_CL;
  int *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  value_type *in_stack_fffffffffffffee8;
  pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>
  *in_stack_fffffffffffffef0;
  
  if ((in_CL & 1) == 0) {
    this = (pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>
            *)anon_unknown_14::getListeners();
    std::pair<int,_doctest::String>::pair<int_&,_const_char_*&,_true>
              ((pair<int,_doctest::String> *)
               CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffed8,(char **)0x115435);
    std::
    pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>
    ::
    pair<std::pair<int,_doctest::String>,_doctest::IReporter_*(*&)(const_doctest::ContextOptions_&),_true>
              (this,&in_stack_fffffffffffffee8->first,
               (_func_IReporter_ptr_ContextOptions_ptr **)
               CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    std::
    map<std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&),_std::less<std::pair<int,_doctest::String>_>,_std::allocator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>_>
    ::insert((map<std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&),_std::less<std::pair<int,_doctest::String>_>,_std::allocator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>_>
              *)this,in_stack_fffffffffffffee8);
    std::
    pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>
    ::~pair((pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>
             *)0x115484);
    std::pair<int,_doctest::String>::~pair((pair<int,_doctest::String> *)0x11548e);
  }
  else {
    anon_unknown_14::getReporters();
    std::pair<int,_doctest::String>::pair<int_&,_const_char_*&,_true>
              ((pair<int,_doctest::String> *)
               CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffed8,(char **)0x115353);
    std::
    pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>
    ::
    pair<std::pair<int,_doctest::String>,_doctest::IReporter_*(*&)(const_doctest::ContextOptions_&),_true>
              (in_stack_fffffffffffffef0,&in_stack_fffffffffffffee8->first,
               (_func_IReporter_ptr_ContextOptions_ptr **)
               CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    std::
    map<std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&),_std::less<std::pair<int,_doctest::String>_>,_std::allocator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>_>
    ::insert((map<std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&),_std::less<std::pair<int,_doctest::String>_>,_std::allocator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>_>
              *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    std::
    pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>
    ::~pair((pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>
             *)0x1153b1);
    std::pair<int,_doctest::String>::~pair((pair<int,_doctest::String> *)0x1153be);
  }
  return;
}

Assistant:

void registerReporterImpl(const char* name, int priority, reporterCreatorFunc c, bool isReporter) {
        if(isReporter)
            getReporters().insert(reporterMap::value_type(reporterMap::key_type(priority, name), c));
        else
            getListeners().insert(reporterMap::value_type(reporterMap::key_type(priority, name), c));
    }